

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusxml2cpp.cpp
# Opt level: O0

QByteArray * __thiscall
QDBusXmlToCpp::qtTypeName
          (QDBusXmlToCpp *this,SourceLocation *location,QString *signature,Annotations *annotations,
          qsizetype paramId,char *direction)

{
  QLatin1StringView str;
  QLatin1StringView str_00;
  QAnyStringView s;
  QLatin1StringView str_01;
  QLatin1StringView str_02;
  QAnyStringView s_00;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  DiagnosticsReporter *pDVar4;
  QString *in_RCX;
  SourceLocation *in_RDX;
  long in_RSI;
  QByteArray *in_RDI;
  long in_R9;
  long in_FS_OFFSET;
  int type;
  QString oldAnnotationName;
  QString qttype;
  Annotation annotation;
  QString annotationName;
  ArgBase *argBases [2];
  ArgBase *argBases_1 [2];
  int in_stack_fffffffffffffb58;
  int in_stack_fffffffffffffb5c;
  Annotation *in_stack_fffffffffffffb60;
  QAnyStringView *in_stack_fffffffffffffb68;
  SourceLocation *location_00;
  Annotation *in_stack_fffffffffffffb70;
  undefined6 in_stack_fffffffffffffb78;
  undefined6 uVar5;
  QChar in_stack_fffffffffffffb7e;
  undefined2 uVar6;
  QMap<QString,_QDBusIntrospection::Annotation> *in_stack_fffffffffffffb80;
  undefined8 *puVar7;
  QMetaType local_398 [13];
  undefined1 local_330 [134];
  QChar local_2aa;
  undefined8 local_2a8 [2];
  QLatin1StringView local_298;
  undefined1 local_288 [48];
  QString local_258;
  QString local_240;
  undefined1 local_228 [64];
  SourceLocation local_1e8 [2];
  undefined1 auStack_1c0 [30];
  QChar local_1a2 [9];
  QLatin1StringView local_190;
  undefined1 local_180 [48];
  QString local_150 [2];
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined1 local_f8 [24];
  qsizetype local_e0;
  char *local_d8;
  ulong local_d0;
  ArgBase **local_c8;
  undefined1 local_a0 [24];
  qsizetype local_88;
  char *local_80;
  ulong local_78;
  ArgBase **local_70;
  ulong local_68;
  ArgBase **local_60;
  ulong local_58;
  ArgBase **local_50;
  ulong local_48;
  ArgBase **local_40;
  ulong local_38;
  ArgBase **local_30;
  undefined1 *local_28;
  undefined8 local_20;
  undefined1 *local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QString::toLatin1((QString *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  pcVar3 = QByteArray::operator_cast_to_char_((QByteArray *)0x105db0);
  local_120 = QDBusMetaType::signatureToMetaType(pcVar3);
  iVar2 = QMetaType::id((QMetaType *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c);
  QByteArray::~QByteArray((QByteArray *)0x105de3);
  if (iVar2 == 0) {
    local_150[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_150[0].d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_150[0].d.size = -0x5555555555555556;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)CONCAT26(in_stack_fffffffffffffb7e.ucs,in_stack_fffffffffffffb78),
               (size_t)in_stack_fffffffffffffb70);
    if (-1 < in_R9) {
      local_190 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60);
      QLatin1String::QLatin1String
                ((QLatin1String *)in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68);
      local_88 = local_190.m_size;
      local_80 = local_190.m_data;
      str.m_data._0_6_ = in_stack_fffffffffffffb78;
      str.m_size = (qsizetype)in_stack_fffffffffffffb70;
      str.m_data._6_2_ = in_stack_fffffffffffffb7e.ucs;
      QAnyStringView::QAnyStringView(in_stack_fffffffffffffb68,str);
      str_00.m_data._0_6_ = in_stack_fffffffffffffb78;
      str_00.m_size = (qsizetype)in_stack_fffffffffffffb70;
      str_00.m_data._6_2_ = in_stack_fffffffffffffb7e.ucs;
      QAnyStringView::QAnyStringView(in_stack_fffffffffffffb68,str_00);
      s.m_size._0_6_ = in_stack_fffffffffffffb78;
      s.field_0.m_data = in_stack_fffffffffffffb70;
      s.m_size._6_2_ = in_stack_fffffffffffffb7e.ucs;
      QtPrivate::qStringLikeToArg(s);
      local_58 = local_78;
      local_50 = local_70;
      local_28 = local_a0;
      local_20 = 0;
      local_68 = local_78;
      local_60 = local_70;
      QtPrivate::argToQString((QAnyStringView *)local_180,local_78,local_70);
      QChar::QChar<char16_t,_true>(local_1a2,L' ');
      QString::arg<long_long,_true>
                ((QString *)in_stack_fffffffffffffb68,(longlong)in_stack_fffffffffffffb60,
                 in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58,in_stack_fffffffffffffb7e);
      QString::operator+=((QString *)in_stack_fffffffffffffb60,
                          (QString *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      QString::~QString((QString *)0x10607f);
      QString::~QString((QString *)0x10608c);
    }
    memset(local_1e8,0xaa,0x40);
    memset(local_228,0,0x40);
    QDBusIntrospection::Annotation::Annotation(in_stack_fffffffffffffb60);
    QMap<QString,_QDBusIntrospection::Annotation>::value
              (in_stack_fffffffffffffb80,
               (QString *)CONCAT26(in_stack_fffffffffffffb7e.ucs,in_stack_fffffffffffffb78),
               in_stack_fffffffffffffb70);
    QDBusIntrospection::Annotation::~Annotation(in_stack_fffffffffffffb60);
    local_240.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_240.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_240.d.size = -0x5555555555555556;
    QString::QString((QString *)in_stack_fffffffffffffb60,
                     (QString *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    bVar1 = QString::isEmpty((QString *)0x106153);
    if (bVar1) {
      local_258.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_258.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_258.d.size = -0x5555555555555556;
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)CONCAT26(in_stack_fffffffffffffb7e.ucs,in_stack_fffffffffffffb78),
                 (size_t)in_stack_fffffffffffffb70);
      if (-1 < in_R9) {
        local_298 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60);
        QLatin1String::QLatin1String
                  ((QLatin1String *)in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68);
        puVar7 = local_2a8;
        local_e0 = local_298.m_size;
        local_d8 = local_298.m_data;
        str_01.m_data._0_6_ = in_stack_fffffffffffffb78;
        str_01.m_size = (qsizetype)in_stack_fffffffffffffb70;
        str_01.m_data._6_2_ = in_stack_fffffffffffffb7e.ucs;
        QAnyStringView::QAnyStringView(in_stack_fffffffffffffb68,str_01);
        local_118 = *puVar7;
        local_110 = puVar7[1];
        str_02.m_data._0_6_ = in_stack_fffffffffffffb78;
        str_02.m_size = (qsizetype)in_stack_fffffffffffffb70;
        str_02.m_data._6_2_ = in_stack_fffffffffffffb7e.ucs;
        QAnyStringView::QAnyStringView(in_stack_fffffffffffffb68,str_02);
        s_00.m_size._0_6_ = in_stack_fffffffffffffb78;
        s_00.field_0.m_data = in_stack_fffffffffffffb70;
        s_00.m_size._6_2_ = in_stack_fffffffffffffb7e.ucs;
        QtPrivate::qStringLikeToArg(s_00);
        local_38 = local_d0;
        local_30 = local_c8;
        local_18 = local_f8;
        local_10 = 0;
        local_48 = local_d0;
        local_40 = local_c8;
        QtPrivate::argToQString((QAnyStringView *)local_288,local_d0,local_c8);
        QChar::QChar<char16_t,_true>(&local_2aa,L' ');
        QString::arg<long_long,_true>
                  ((QString *)in_stack_fffffffffffffb68,(longlong)in_stack_fffffffffffffb60,
                   in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58,in_stack_fffffffffffffb7e);
        QString::operator+=((QString *)in_stack_fffffffffffffb60,
                            (QString *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58)
                           );
        QString::~QString((QString *)0x1063f9);
        QString::~QString((QString *)0x106406);
      }
      memset(local_330,0,0x40);
      QDBusIntrospection::Annotation::Annotation(in_stack_fffffffffffffb60);
      QMap<QString,_QDBusIntrospection::Annotation>::value
                (in_stack_fffffffffffffb80,
                 (QString *)CONCAT26(in_stack_fffffffffffffb7e.ucs,in_stack_fffffffffffffb78),
                 in_stack_fffffffffffffb70);
      QDBusIntrospection::Annotation::operator=
                (in_stack_fffffffffffffb60,
                 (Annotation *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      QDBusIntrospection::Annotation::~Annotation(in_stack_fffffffffffffb60);
      QDBusIntrospection::Annotation::~Annotation(in_stack_fffffffffffffb60);
      QString::operator=(&local_240,(QString *)auStack_1c0);
      bVar1 = QString::isEmpty((QString *)0x1064ab);
      if (bVar1) {
        pDVar4 = (DiagnosticsReporter *)(in_RSI + 200);
        QtPrivate::asString(in_RCX);
        QString::toLocal8Bit
                  ((QString *)CONCAT26(in_stack_fffffffffffffb7e.ucs,in_stack_fffffffffffffb78));
        pcVar3 = QByteArray::constData((QByteArray *)0x1064fb);
        DiagnosticsReporter::error(pDVar4,in_RDX,"unknown type `%s\'\n",pcVar3);
        QByteArray::~QByteArray((QByteArray *)0x106523);
        QtPrivate::asString(local_150);
        QString::toLocal8Bit
                  ((QString *)CONCAT26(in_stack_fffffffffffffb7e.ucs,in_stack_fffffffffffffb78));
        pcVar3 = QByteArray::constData((QByteArray *)0x10656a);
        DiagnosticsReporter::note
                  ((DiagnosticsReporter *)(in_RSI + 200),in_RDX,
                   "you should add <annotation name=\"%s\" value=\"<type>\"/>\n",pcVar3);
        QByteArray::~QByteArray((QByteArray *)0x106592);
        exit(1);
      }
      in_stack_fffffffffffffb60 = (Annotation *)(in_RSI + 200);
      location_00 = local_1e8;
      QtPrivate::asString(&local_258);
      QString::toLocal8Bit
                ((QString *)CONCAT26(in_stack_fffffffffffffb7e.ucs,in_stack_fffffffffffffb78));
      pcVar3 = QByteArray::constData((QByteArray *)0x1065e3);
      DiagnosticsReporter::warning
                ((DiagnosticsReporter *)in_stack_fffffffffffffb60,location_00,
                 "deprecated annotation \'%s\' found\n",pcVar3);
      QByteArray::~QByteArray((QByteArray *)0x10660b);
      pDVar4 = (DiagnosticsReporter *)(in_RSI + 200);
      uVar5 = SUB86(local_1e8,0);
      uVar6 = (undefined2)((ulong)local_1e8 >> 0x30);
      QtPrivate::asString(local_150);
      QString::toLocal8Bit((QString *)CONCAT26(uVar6,uVar5));
      pcVar3 = QByteArray::constData((QByteArray *)0x106652);
      DiagnosticsReporter::note
                (pDVar4,(SourceLocation *)CONCAT26(uVar6,uVar5),"suggest updating to \'%s\'\n",
                 pcVar3);
      QByteArray::~QByteArray((QByteArray *)0x10667a);
      QString::toLatin1((QString *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      QString::~QString((QString *)0x1066a4);
    }
    else {
      QString::toLatin1((QString *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    }
    QString::~QString((QString *)0x1066b1);
    QDBusIntrospection::Annotation::~Annotation(in_stack_fffffffffffffb60);
    QString::~QString((QString *)0x1066cb);
  }
  else {
    QMetaType::QMetaType(local_398,iVar2);
    pcVar3 = QMetaType::name(local_398);
    QByteArray::QByteArray(in_RDI,pcVar3,-1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QDBusXmlToCpp::qtTypeName(const QDBusIntrospection::SourceLocation &location,
                                     const QString &signature,
                                     const QDBusIntrospection::Annotations &annotations,
                                     qsizetype paramId, const char *direction)
{
    int type = QDBusMetaType::signatureToMetaType(signature.toLatin1()).id();
    if (type == QMetaType::UnknownType) {
        QString annotationName = u"org.qtproject.QtDBus.QtTypeName"_s;
        if (paramId >= 0)
            annotationName += ".%1%2"_L1.arg(QLatin1StringView(direction)).arg(paramId);
        auto annotation = annotations.value(annotationName);
        QString qttype = annotation.value;
        if (!qttype.isEmpty())
            return std::move(qttype).toLatin1();

        QString oldAnnotationName = u"com.trolltech.QtDBus.QtTypeName"_s;
        if (paramId >= 0)
            oldAnnotationName += ".%1%2"_L1.arg(QLatin1StringView(direction)).arg(paramId);
        annotation = annotations.value(oldAnnotationName);
        qttype = annotation.value;

        if (qttype.isEmpty()) {
            reporter.error(location, "unknown type `%s'\n", qPrintable(signature));
            reporter.note(location, "you should add <annotation name=\"%s\" value=\"<type>\"/>\n",
                          qPrintable(annotationName));

            exit(1);
        }

        reporter.warning(annotation.location, "deprecated annotation '%s' found\n",
                         qPrintable(oldAnnotationName));
        reporter.note(annotation.location, "suggest updating to '%s'\n",
                      qPrintable(annotationName));
        return std::move(qttype).toLatin1();
    }

    return QMetaType(type).name();
}